

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glew.c
# Opt level: O1

GLboolean glxewGetExtension(char *name)

{
  GLboolean GVar1;
  Display *pDVar2;
  GLubyte *start;
  uint uVar3;
  ulong uVar4;
  
  if (__glewXGetCurrentDisplay != (PFNGLXGETCURRENTDISPLAYPROC)0x0) {
    pDVar2 = (*__glewXGetCurrentDisplay)();
    start = (GLubyte *)glXGetClientString(pDVar2,3);
    if (start != (GLubyte *)0x0) {
      uVar4 = 0xffffffff;
      do {
        uVar3 = (int)uVar4 + 1;
        uVar4 = (ulong)uVar3;
      } while (start[uVar4] != '\0');
      GVar1 = _glewSearchExtension(name,start,start + uVar3);
      return GVar1;
    }
  }
  return '\0';
}

Assistant:

GLboolean glxewGetExtension (const char* name)
{    
  const GLubyte* start;
  const GLubyte* end;

  if (glXGetCurrentDisplay == NULL) return GL_FALSE;
  start = (const GLubyte*)glXGetClientString(glXGetCurrentDisplay(), GLX_EXTENSIONS);
  if (0 == start) return GL_FALSE;
  end = start + _glewStrLen(start);
  return _glewSearchExtension(name, start, end);
}